

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O3

void __thiscall
kj::_::
SplitBranch<kj::_::Tuple<kj::Promise<kj::HttpClient::ConnectRequest::Status>,_kj::Promise<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer>_>_>,_1UL>
::get(SplitBranch<kj::_::Tuple<kj::Promise<kj::HttpClient::ConnectRequest::Status>,_kj::Promise<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer>_>_>,_1UL>
      *this,ExceptionOrValue *output)

{
  ExceptionOrValue *pEVar1;
  PromiseArenaMember *pPVar2;
  
  pEVar1 = ((this->super_ForkBranchBase).hub.ptr)->resultRef;
  if (pEVar1[1].exception.ptr.isSet == true) {
    if (output[1].exception.ptr.isSet == true) {
      output[1].exception.ptr.isSet = false;
      pPVar2 = (PromiseArenaMember *)output[1].exception.ptr.field_1.value.ownFile.content.ptr;
      if (pPVar2 != (PromiseArenaMember *)0x0) {
        output[1].exception.ptr.field_1.value.ownFile.content.ptr = (char *)0x0;
        PromiseDisposer::dispose(pPVar2);
      }
    }
    output[1].exception.ptr.field_1.value.ownFile.content.ptr =
         (char *)pEVar1[1].exception.ptr.field_1.value.ownFile.content.size_;
    pEVar1[1].exception.ptr.field_1.value.ownFile.content.size_ = 0;
    output[1].exception.ptr.isSet = true;
  }
  else if (output[1].exception.ptr.isSet == true) {
    output[1].exception.ptr.isSet = false;
    pPVar2 = (PromiseArenaMember *)output[1].exception.ptr.field_1.value.ownFile.content.ptr;
    if (pPVar2 != (PromiseArenaMember *)0x0) {
      output[1].exception.ptr.field_1.value.ownFile.content.ptr = (char *)0x0;
      PromiseDisposer::dispose(pPVar2);
    }
  }
  if (pEVar1 != output) {
    if ((output->exception).ptr.isSet == true) {
      (output->exception).ptr.isSet = false;
      Exception::~Exception(&(output->exception).ptr.field_1.value);
    }
    if ((pEVar1->exception).ptr.isSet == true) {
      Exception::Exception
                (&(output->exception).ptr.field_1.value,&(pEVar1->exception).ptr.field_1.value);
      (output->exception).ptr.isSet = true;
    }
  }
  ForkBranchBase::releaseHub(&this->super_ForkBranchBase,output);
  return;
}

Assistant:

void get(ExceptionOrValue& output) noexcept override {
    ExceptionOr<T>& hubResult = getHubResultRef().template as<T>();
    KJ_IF_SOME(value, hubResult.value) {
      output.as<Element>().value = kj::mv(kj::get<index>(value));
    } else {
      output.as<Element>().value = kj::none;
    }